

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraffic.h
# Opt level: O2

string * strAtMost(string *__return_storage_ptr__,string *s,size_t m)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (m < s->_M_string_length) {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)s);
    std::operator+(__return_storage_ptr__,&local_30,"...");
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string strAtMost(const std::string s, size_t m) {
    return s.length() <= m ? s :
    s.substr(0, m-3) + "...";
}